

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFwd.hpp
# Opt level: O0

string * __thiscall
CLI::Config::to_flag_abi_cxx11_(string *__return_storage_ptr__,Config *this,ConfigItem *item)

{
  size_type sVar1;
  const_reference pvVar2;
  ConversionError *__return_storage_ptr___00;
  string local_40;
  ConfigItem *local_20;
  ConfigItem *item_local;
  Config *this_local;
  
  local_20 = item;
  item_local = (ConfigItem *)this;
  this_local = (Config *)__return_storage_ptr__;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&item->inputs);
  if (sVar1 == 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&local_20->inputs,0);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (ConversionError *)__cxa_allocate_exception(0x38);
  ConfigItem::fullname_abi_cxx11_(&local_40,local_20);
  ConversionError::TooManyInputsFlag(__return_storage_ptr___00,&local_40);
  __cxa_throw(__return_storage_ptr___00,&ConversionError::typeinfo,ConversionError::~ConversionError
             );
}

Assistant:

virtual std::string to_flag(const ConfigItem &item) const {
        if(item.inputs.size() == 1) {
            return item.inputs.at(0);
        }
        throw ConversionError::TooManyInputsFlag(item.fullname());
    }